

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cpp
# Opt level: O1

ptime booster::ptime::now(void)

{
  ptime pVar1;
  timeval tv;
  timeval local_28;
  ptime local_18;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  local_18.nsec = (int)local_28.tv_usec * 1000;
  local_18.sec = local_28.tv_sec;
  normalize(&local_18);
  pVar1.nsec = local_18.nsec;
  pVar1.sec = local_18.sec;
  pVar1._12_4_ = 0;
  return pVar1;
}

Assistant:

ptime ptime::now()
{
	#ifndef BOOSTER_WIN_NATIVE
	struct timeval tv;
	gettimeofday(&tv,0);
	return ptime(tv.tv_sec,tv.tv_usec * 1000);
	#else
	FILETIME ft;
	GetSystemTimeAsFileTime(&ft);
	unsigned long long tt = ft.dwHighDateTime;
	tt <<=32;
	tt |= ft.dwLowDateTime;
	tt /=10;
	tt -= 11644473600000000ULL;
	return ptime(ptime::microseconds(tt));
	#endif
}